

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.hpp
# Opt level: O0

void __thiscall tf::Topology::_carry_out_promise(Topology *this)

{
  bool bVar1;
  exception_ptr *in_RDI;
  promise<void> *unaff_retaddr;
  exception_ptr e;
  exception_ptr *in_stack_ffffffffffffff98;
  exception_ptr *this_00;
  exception_ptr *this_01;
  exception_ptr *this_02;
  promise<void> *in_stack_ffffffffffffffe0;
  exception_ptr local_18;
  exception_ptr local_10;
  exception_ptr *__p;
  
  __p = in_RDI;
  bVar1 = std::__exception_ptr::exception_ptr::operator_cast_to_bool(in_RDI + 0xe);
  if (bVar1) {
    this_00 = in_RDI + 0xe;
    this_02 = &local_10;
    std::__exception_ptr::exception_ptr::exception_ptr(this_00,in_stack_ffffffffffffff98);
    this_01 = &local_18;
    std::__exception_ptr::exception_ptr::exception_ptr(this_01,(nullptr_t)0x0);
    std::__exception_ptr::exception_ptr::operator=(this_02,this_01);
    std::__exception_ptr::exception_ptr::~exception_ptr(this_00);
    std::__exception_ptr::exception_ptr::exception_ptr(this_00,in_stack_ffffffffffffff98);
    std::promise<void>::set_exception(unaff_retaddr,__p);
    std::__exception_ptr::exception_ptr::~exception_ptr(this_00);
    std::__exception_ptr::exception_ptr::~exception_ptr(this_00);
  }
  else {
    std::promise<void>::set_value(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

inline void Topology::_carry_out_promise() {
  if(_exception_ptr) {
    auto e = _exception_ptr;
    _exception_ptr = nullptr;
    _promise.set_exception(e);
  }
  else {
    _promise.set_value();
  }
}